

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O2

string * __thiscall
Helpers::readFromFile_abi_cxx11_(string *__return_storage_ptr__,Helpers *this,ifstream *_in)

{
  size_type __n;
  ostream *poVar1;
  runtime_error *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 5) == 0) {
    std::istream::seekg((long)this,_S_beg);
    __n = std::istream::tellg();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,__n);
    std::istream::seekg((long)this,_S_beg);
    std::istream::read((char *)this,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
    poVar1 = std::operator<<((ostream *)&std::cout,"Size of input file: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ifstream::close();
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error, unable to open file!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Helpers::readFromFile(std::ifstream& _in) {
  std::string tmp;
  if (_in) {
    _in.seekg(0, std::ios::end);
    tmp.resize(_in.tellg());
    _in.seekg(0, std::ios::beg);
    _in.read(&tmp[0], tmp.size());

    std::cout << "Size of input file: " << tmp.size() << std::endl;
    
    _in.close();
  } else
    throw std::runtime_error("Error, unable to open file!");
  return tmp;
}